

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_append_mapping_pair(yaml_document_t *document,int mapping,int key,int value)

{
  yaml_node_t *pyVar1;
  yaml_node_pair_t *pyVar2;
  yaml_node_pair_t yVar3;
  int iVar4;
  yaml_node_pair_t pair;
  anon_struct_4_1_a7dec128 context;
  int value_local;
  int key_local;
  int mapping_local;
  yaml_document_t *document_local;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x55c,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
  }
  if ((mapping < 1) || ((document->nodes).top < (document->nodes).start + mapping)) {
    __assert_fail("mapping > 0 && document->nodes.start + mapping <= document->nodes.top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x55e,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
  }
  if ((document->nodes).start[mapping + -1].type != YAML_MAPPING_NODE) {
    __assert_fail("document->nodes.start[mapping-1].type == YAML_MAPPING_NODE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x560,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
  }
  if ((0 < key) && ((document->nodes).start + key <= (document->nodes).top)) {
    if ((0 < value) && ((document->nodes).start + value <= (document->nodes).top)) {
      if (((document->nodes).start[mapping + -1].data.sequence.items.top ==
           (yaml_node_item_t *)(document->nodes).start[mapping + -1].data.scalar.length) &&
         (iVar4 = yaml_stack_extend((void **)&(document->nodes).start[mapping + -1].data,
                                    (void **)((long)&(document->nodes).start[mapping + -1].data +
                                             0x10),
                                    (void **)&(document->nodes).start[mapping + -1].data.scalar.
                                              length), iVar4 == 0)) {
        document_local._4_4_ = 0;
      }
      else {
        pyVar1 = (document->nodes).start;
        pyVar2 = pyVar1[mapping + -1].data.mapping.pairs.top;
        pyVar1[mapping + -1].data.mapping.pairs.top = pyVar2 + 1;
        yVar3.value = value;
        yVar3.key = key;
        *pyVar2 = yVar3;
        document_local._4_4_ = 1;
      }
      return document_local._4_4_;
    }
    __assert_fail("value > 0 && document->nodes.start + value <= document->nodes.top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x564,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
  }
  __assert_fail("key > 0 && document->nodes.start + key <= document->nodes.top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x562,"int yaml_document_append_mapping_pair(yaml_document_t *, int, int, int)");
}

Assistant:

YAML_DECLARE(int)
yaml_document_append_mapping_pair(yaml_document_t *document,
        int mapping, int key, int value)
{
    struct {
        yaml_error_type_t error;
    } context;

    yaml_node_pair_t pair;

    assert(document);       /* Non-NULL document is required. */
    assert(mapping > 0
            && document->nodes.start + mapping <= document->nodes.top);
                            /* Valid mapping id is required. */
    assert(document->nodes.start[mapping-1].type == YAML_MAPPING_NODE);
                            /* A mapping node is required. */
    assert(key > 0 && document->nodes.start + key <= document->nodes.top);
                            /* Valid key id is required. */
    assert(value > 0 && document->nodes.start + value <= document->nodes.top);
                            /* Valid value id is required. */

    pair.key = key;
    pair.value = value;

    if (!PUSH(&context,
                document->nodes.start[mapping-1].data.mapping.pairs, pair))
        return 0;

    return 1;
}